

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O1

Node * __thiscall
llvm::FoldingSetBase::FindNodeOrInsertPos
          (FoldingSetBase *this,FoldingSetNodeID *ID,void **InsertPos)

{
  uint uVar1;
  uint *first;
  void **ppvVar2;
  int iVar3;
  type tVar4;
  int iVar5;
  Node *pNVar6;
  Node *pNVar7;
  FoldingSetNodeID TempID;
  Node *local_c8;
  undefined1 *local_c0;
  ulong local_b8;
  undefined1 local_b0 [128];
  
  first = (uint *)(ID->Bits).super_SmallVectorImpl<unsigned_int>.
                  super_SmallVectorTemplateBase<unsigned_int,_true>.
                  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX;
  tVar4 = hashing::detail::hash_combine_range_impl<unsigned_int_const>
                    (first,first + (ID->Bits).super_SmallVectorImpl<unsigned_int>.
                                   super_SmallVectorTemplateBase<unsigned_int,_true>.
                                   super_SmallVectorTemplateCommon<unsigned_int,_void>.
                                   super_SmallVectorBase.Size);
  ppvVar2 = this->Buckets;
  uVar1 = this->NumBuckets;
  pNVar6 = (Node *)ppvVar2[uVar1 - 1 & (uint)tVar4.value];
  *InsertPos = (void *)0x0;
  local_c0 = local_b0;
  local_b8 = 0x2000000000;
  do {
    pNVar7 = (Node *)0x0;
    if (((ulong)pNVar6 & 1) == 0) {
      pNVar7 = pNVar6;
    }
    if (pNVar7 == (Node *)0x0) {
      iVar5 = 3;
      pNVar7 = local_c8;
    }
    else {
      iVar3 = (*this->_vptr_FoldingSetBase[2])(this,pNVar7,ID,tVar4.value & 0xffffffff,&local_c0);
      iVar5 = 1;
      if ((char)iVar3 == '\0') {
        local_b8 = local_b8 & 0xffffffff00000000;
        pNVar6 = (Node *)pNVar7->NextInFoldingSetBucket;
        iVar5 = 0;
        pNVar7 = local_c8;
      }
    }
    local_c8 = pNVar7;
  } while (iVar5 == 0);
  if (iVar5 == 3) {
    *InsertPos = ppvVar2 + (uVar1 - 1 & (uint)tVar4.value);
    local_c8 = (Node *)0x0;
  }
  if (local_c0 != local_b0) {
    free(local_c0);
  }
  return local_c8;
}

Assistant:

FoldingSetBase::Node *
FoldingSetBase::FindNodeOrInsertPos(const FoldingSetNodeID &ID,
                                    void *&InsertPos) {
  unsigned IDHash = ID.ComputeHash();
  void **Bucket = GetBucketFor(IDHash, Buckets, NumBuckets);
  void *Probe = *Bucket;

  InsertPos = nullptr;

  FoldingSetNodeID TempID;
  while (Node *NodeInBucket = GetNextPtr(Probe)) {
    if (NodeEquals(NodeInBucket, ID, IDHash, TempID))
      return NodeInBucket;
    TempID.clear();

    Probe = NodeInBucket->getNextInBucket();
  }

  // Didn't find the node, return null with the bucket as the InsertPos.
  InsertPos = Bucket;
  return nullptr;
}